

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintSecondDerivatives
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  VectorDynSize *vec;
  element_type *peVar1;
  int iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  MatrixDynSize *pMVar7;
  pointer pcVar8;
  undefined4 uVar9;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1e0;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  ostringstream errorMsg;
  
  peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    psVar5 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar8 = (psVar5->_M_dataplus)._M_p;
    pcVar6 = "Dynamical system not set.";
LAB_001b135d:
    iDynTree::reportError(pcVar8,"evaluateCollocationConstraintSecondDerivatives",pcVar6);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        iVar2 = (*peVar1->_vptr_DynamicalSystem[3])();
        if ((char)iVar2 == '\0') {
          psVar5 = IntegratorInfo::name_abi_cxx11_
                             (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar8 = (psVar5->_M_dataplus)._M_p;
          pcVar6 = "Error while setting the control input.";
        }
        else {
          toEigen(&local_1e0,lambda);
          vec = &this->m_lambda;
          toEigen(&local_1c0,vec);
          Eigen::internal::
          call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>>
                    (&local_1c0,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&errorMsg);
          peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          uVar9 = SUB84(time,0);
          iVar2 = (*peVar1->_vptr_DynamicalSystem[0xd])
                            (uVar9,peVar1,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,vec,
                             &this->m_stateHessianBuffer);
          if ((char)iVar2 == '\0') {
            psVar5 = IntegratorInfo::name_abi_cxx11_
                               (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar8 = (psVar5->_M_dataplus)._M_p;
            pcVar6 = "Error while evaluating the dynamical system state second derivative.";
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,0);
            pmVar3 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_stateHessianBuffer);
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,0,1);
            pmVar3 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_zeroNxNxBuffer);
            CollocationHessianIndex::CollocationHessianIndex
                      ((CollocationHessianIndex *)&errorMsg,1,1);
            pmVar3 = std::
                     map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                     ::operator[](stateSecondDerivative,(CollocationHessianIndex *)&errorMsg);
            iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_zeroNxNxBuffer);
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[0xe])
                              (uVar9,peVar1,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,vec,
                               &this->m_controlHessianBuffer);
            if ((char)iVar2 == '\0') {
              psVar5 = IntegratorInfo::name_abi_cxx11_
                                 (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar8 = (psVar5->_M_dataplus)._M_p;
              pcVar6 = "Error while evaluating the dynamical system control second derivative.";
            }
            else {
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,0,0);
              pmVar3 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_controlHessianBuffer);
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,0,1);
              pmVar3 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_zeroNuNuBuffer);
              CollocationHessianIndex::CollocationHessianIndex
                        ((CollocationHessianIndex *)&errorMsg,1,1);
              pmVar3 = std::
                       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                       ::operator[](controlSecondDerivative,(CollocationHessianIndex *)&errorMsg);
              iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_zeroNuNuBuffer);
              peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar2 = (*peVar1->_vptr_DynamicalSystem[0xf])
                                (uVar9,peVar1,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start,vec,
                                 &this->m_mixedHessianBuffer);
              if ((char)iVar2 != '\0') {
                CollocationHessianIndex::CollocationHessianIndex
                          ((CollocationHessianIndex *)&errorMsg,0,0);
                pmVar3 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[](stateControlSecondDerivative,
                                      (CollocationHessianIndex *)&errorMsg);
                iDynTree::MatrixDynSize::operator=(pmVar3,&this->m_mixedHessianBuffer);
                pMVar7 = &this->m_zeroNxNuBuffer;
                CollocationHessianIndex::CollocationHessianIndex
                          ((CollocationHessianIndex *)&errorMsg,0,1);
                pmVar3 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[](stateControlSecondDerivative,
                                      (CollocationHessianIndex *)&errorMsg);
                iDynTree::MatrixDynSize::operator=(pmVar3,pMVar7);
                CollocationHessianIndex::CollocationHessianIndex
                          ((CollocationHessianIndex *)&errorMsg,1,0);
                pmVar3 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[](stateControlSecondDerivative,
                                      (CollocationHessianIndex *)&errorMsg);
                iDynTree::MatrixDynSize::operator=(pmVar3,pMVar7);
                CollocationHessianIndex::CollocationHessianIndex
                          ((CollocationHessianIndex *)&errorMsg,1,1);
                pmVar3 = std::
                         map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                         ::operator[](stateControlSecondDerivative,
                                      (CollocationHessianIndex *)&errorMsg);
                iDynTree::MatrixDynSize::operator=(pmVar3,pMVar7);
                return true;
              }
              psVar5 = IntegratorInfo::name_abi_cxx11_
                                 (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar8 = (psVar5->_M_dataplus)._M_p;
              pcVar6 = 
              "Error while evaluating the dynamical system second derivative wrt state and control."
              ;
            }
          }
        }
        goto LAB_001b135d;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the control inputs does not match the expected one. Input = "
                     );
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar4,", Expected = 2.");
      psVar5 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar6,"evaluateCollocationConstraintSecondDerivatives",
                 (char *)local_1e0.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar4,", Expected = 2.");
      psVar5 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar6,"evaluateCollocationConstraintSecondDerivatives",
                 (char *)local_1e0.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
  }
  return false;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                              const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                              const VectorDynSize &lambda, CollocationHessianMap &stateSecondDerivative,
                                                                              CollocationHessianMap &controlSecondDerivative, CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNuNuBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_zeroNxNuBuffer;


                return true;
            }